

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

Address * __thiscall
cfd::core::DescriptorScriptReference::GenerateAddress
          (Address *__return_storage_ptr__,DescriptorScriptReference *this,NetType net_type)

{
  Script *this_00;
  bool bVar1;
  DescriptorScriptType DVar2;
  WitnessVersion WVar3;
  CfdException *pCVar4;
  Pubkey pubkey;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  DVar2 = this->script_type_;
  switch(DVar2) {
  case kDescriptorScriptPk:
  case kDescriptorScriptPkh:
  case kDescriptorScriptMulti:
  case kDescriptorScriptSortedMulti:
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &((this->keys_).
                 super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ._M_impl.super__Vector_impl_data._M_start)->pubkey_);
    break;
  case kDescriptorScriptWpkh:
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &((this->keys_).
                 super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ._M_impl.super__Vector_impl_data._M_start)->pubkey_);
LAB_0035fad6:
    core::Address::Address(__return_storage_ptr__,net_type,kVersion0,&pubkey,&this->addr_prefixes_);
    goto LAB_0035faef;
  case kDescriptorScriptCombo:
    bVar1 = Script::IsP2shScript(&this->locking_script_);
    if (bVar1) {
      DVar2 = this->script_type_;
      goto switchD_0035f916_caseD_b;
    }
    bVar1 = Script::IsP2wpkhScript(&this->locking_script_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &((this->keys_).
                 super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ._M_impl.super__Vector_impl_data._M_start)->pubkey_);
    if (bVar1) goto LAB_0035fad6;
    break;
  case kDescriptorScriptAddr:
    if ((this->address_script_).type_ == net_type) {
      core::Address::Address(__return_storage_ptr__,&this->address_script_);
      return __return_storage_ptr__;
    }
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcore_descriptor.cpp";
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x26a;
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "GenerateAddress";
    logger::warn<>((CfdSourceLocation *)&pubkey,"Failed to nettype. unmatch address nettype.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&pubkey,"unmatch address nettype.",(allocator *)&local_48);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&pubkey);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  case kDescriptorScriptRaw:
    this_00 = &this->locking_script_;
    bVar1 = Script::IsP2wpkhScript(this_00);
    if (((bVar1) || (bVar1 = Script::IsTaprootScript(this_00), bVar1)) ||
       (bVar1 = Script::IsP2wshScript(this_00), bVar1)) {
      Script::GetElementList
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 &local_48,this_00);
      ScriptElement::GetBinaryData
                (&pubkey.data_,
                 (ScriptElement *)(local_48._M_impl.super__Vector_impl_data._M_start + 0x60));
      ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 &local_48);
      WVar3 = Script::GetWitnessVersion(this_00);
      core::Address::Address
                (__return_storage_ptr__,net_type,WVar3,&pubkey.data_,&this->addr_prefixes_);
    }
    else {
      bVar1 = Script::IsP2shScript(this_00);
      if (bVar1) {
        Script::GetElementList
                  ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                   &local_48,this_00);
        ScriptElement::GetBinaryData
                  (&pubkey.data_,
                   (ScriptElement *)(local_48._M_impl.super__Vector_impl_data._M_start + 0x60));
        ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                  ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                   &local_48);
        ByteData160::ByteData160((ByteData160 *)&local_48,&pubkey.data_);
        core::Address::Address
                  (__return_storage_ptr__,net_type,kP2shAddress,(ByteData160 *)&local_48,
                   &this->addr_prefixes_);
      }
      else {
        bVar1 = Script::IsP2pkhScript(this_00);
        if (!bVar1) {
          pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = "cfdcore_descriptor.cpp";
          pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x264;
          pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = "GenerateAddress";
          logger::warn<>((CfdSourceLocation *)&pubkey,"raw type descriptor is not support.");
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&pubkey,"raw type descriptor is not support.",(allocator *)&local_48)
          ;
          CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&pubkey);
          __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
        }
        Script::GetElementList
                  ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                   &local_48,this_00);
        ScriptElement::GetBinaryData
                  (&pubkey.data_,
                   (ScriptElement *)(local_48._M_impl.super__Vector_impl_data._M_start + 0xc0));
        ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                  ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                   &local_48);
        ByteData160::ByteData160((ByteData160 *)&local_48,&pubkey.data_);
        core::Address::Address
                  (__return_storage_ptr__,net_type,kP2pkhAddress,(ByteData160 *)&local_48,
                   &this->addr_prefixes_);
      }
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    }
    goto LAB_0035faef;
  default:
switchD_0035f916_caseD_b:
    if (DVar2 != kDescriptorScriptWsh) {
      core::Address::Address
                (__return_storage_ptr__,net_type,&this->redeem_script_,&this->addr_prefixes_);
      return __return_storage_ptr__;
    }
  case kDescriptorScriptWsh:
    core::Address::Address
              (__return_storage_ptr__,net_type,kVersion0,&this->redeem_script_,&this->addr_prefixes_
              );
    return __return_storage_ptr__;
  case kDescriptorScriptTaproot:
    WVar3 = Script::GetWitnessVersion(&this->locking_script_);
    Script::GetElementList
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &local_48,&this->locking_script_);
    ScriptElement::GetBinaryData
              (&pubkey.data_,
               (ScriptElement *)(local_48._M_impl.super__Vector_impl_data._M_start + 0x60));
    core::Address::Address
              (__return_storage_ptr__,net_type,WVar3,&pubkey.data_,&this->addr_prefixes_);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &local_48);
    return __return_storage_ptr__;
  }
  core::Address::Address(__return_storage_ptr__,net_type,&pubkey,&this->addr_prefixes_);
LAB_0035faef:
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  return __return_storage_ptr__;
}

Assistant:

Address DescriptorScriptReference::GenerateAddress(NetType net_type) const {
  bool is_key = false;
  bool is_witness = false;
  switch (script_type_) {
    case DescriptorScriptType::kDescriptorScriptRaw:
      if (locking_script_.IsP2wpkhScript() ||
          locking_script_.IsTaprootScript() ||
          locking_script_.IsP2wshScript()) {
        auto hash = locking_script_.GetElementList()[1].GetBinaryData();
        return Address(
            net_type, locking_script_.GetWitnessVersion(), hash,
            addr_prefixes_);
      } else if (locking_script_.IsP2shScript()) {
        auto hash = locking_script_.GetElementList()[1].GetBinaryData();
        return Address(
            net_type, AddressType::kP2shAddress, ByteData160(hash),
            addr_prefixes_);
      } else if (locking_script_.IsP2pkhScript()) {
        auto hash = locking_script_.GetElementList()[2].GetBinaryData();
        return Address(
            net_type, AddressType::kP2pkhAddress, ByteData160(hash),
            addr_prefixes_);
      }
      warn(CFD_LOG_SOURCE, "raw type descriptor is not support.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "raw type descriptor is not support.");
    case DescriptorScriptType::kDescriptorScriptAddr:
      if (net_type != address_script_.GetNetType()) {
        warn(CFD_LOG_SOURCE, "Failed to nettype. unmatch address nettype.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "unmatch address nettype.");
      }
      return address_script_;
    case DescriptorScriptType::kDescriptorScriptWpkh:
      is_witness = true;
      // fall-through
    case DescriptorScriptType::kDescriptorScriptPk:
    case DescriptorScriptType::kDescriptorScriptPkh:
    case DescriptorScriptType::kDescriptorScriptMulti:
    case DescriptorScriptType::kDescriptorScriptSortedMulti:
      is_key = true;
      break;
    case DescriptorScriptType::kDescriptorScriptCombo:
      if (!locking_script_.IsP2shScript()) {
        is_key = true;
        is_witness = locking_script_.IsP2wpkhScript();
      }
      break;
    case DescriptorScriptType::kDescriptorScriptWsh:
      is_witness = true;
      break;
    case DescriptorScriptType::kDescriptorScriptTaproot:
      return Address(
          net_type, locking_script_.GetWitnessVersion(),
          locking_script_.GetElementList()[1].GetBinaryData(), addr_prefixes_);
    default:
      // case DescriptorScriptType::kDescriptorScriptSh:
      break;
  }
  if (is_key) {
    Pubkey pubkey = keys_[0].GetPubkey();
    if (is_witness) {
      return Address(
          net_type, WitnessVersion::kVersion0, pubkey, addr_prefixes_);
    } else {
      return Address(net_type, pubkey, addr_prefixes_);
    }
  }

  if (script_type_ == DescriptorScriptType::kDescriptorScriptWsh) {
    return Address(
        net_type, WitnessVersion::kVersion0, redeem_script_, addr_prefixes_);
  }
  if (script_type_ == DescriptorScriptType::kDescriptorScriptWsh) {
    return Address(
        net_type, WitnessVersion::kVersion0, redeem_script_, addr_prefixes_);
  }
  return Address(net_type, redeem_script_, addr_prefixes_);
}